

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.h
# Opt level: O0

unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>
tonk::MakeUniqueNoThrow<asio::io_context::strand,asio::io_context&>(io_context *args)

{
  void *pvVar1;
  strand *in_RDI;
  _Head_base<0UL,_asio::io_context::strand_*,_false> this;
  
  this._M_head_impl = in_RDI;
  pvVar1 = operator_new(0x10,(nothrow_t *)&std::nothrow);
  if (pvVar1 != (void *)0x0) {
    asio::io_context::strand::strand(this._M_head_impl,(io_context *)in_RDI);
  }
  std::unique_ptr<asio::io_context::strand,std::default_delete<asio::io_context::strand>>::
  unique_ptr<std::default_delete<asio::io_context::strand>,void>
            ((unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_> *
             )this._M_head_impl,in_RDI);
  return (__uniq_ptr_data<asio::io_context::strand,_std::default_delete<asio::io_context::strand>,_true,_true>
          )(tuple<asio::io_context::strand_*,_std::default_delete<asio::io_context::strand>_>)
           this._M_head_impl;
}

Assistant:

inline std::unique_ptr<T> MakeUniqueNoThrow(Args&&... args) {
    return std::unique_ptr<T>(new(std::nothrow) T(std::forward<Args>(args)...));
}